

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O0

uint32_t labpack_read_u32(labpack_reader_t *reader)

{
  _Bool _Var1;
  uint32_t local_14;
  uint32_t value;
  labpack_reader_t *reader_local;
  
  if (reader == (labpack_reader_t *)0x0) {
    __assert_fail("reader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                  ,0xac,"uint32_t labpack_read_u32(labpack_reader_t *)");
  }
  local_14 = 0;
  _Var1 = labpack_reader_is_ok(reader);
  if (_Var1) {
    local_14 = mpack_expect_u32(reader->decoder);
    labpack_reader_check_decoder(reader);
  }
  return local_14;
}

Assistant:

uint32_t
labpack_read_u32(labpack_reader_t* reader)
{
    assert(reader);
    uint32_t value = 0;
    if (labpack_reader_is_ok(reader)) {
        value = mpack_expect_u32(reader->decoder);
        labpack_reader_check_decoder(reader);
    }
    return value;
}